

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pscp.c
# Opt level: O0

sftp_packet * sftp_wait_for_reply(sftp_request *req)

{
  sftp_packet *pktin_00;
  sftp_request *psVar1;
  char *pcVar2;
  sftp_request *rreq;
  sftp_packet *pktin;
  sftp_request *req_local;
  
  sftp_register(req);
  pktin_00 = sftp_recv();
  if (pktin_00 == (sftp_packet *)0x0) {
    seat_connection_fatal(pscp_seat,"did not receive SFTP response packet from server");
  }
  psVar1 = sftp_find_request(pktin_00);
  if (psVar1 != req) {
    pcVar2 = fxp_error();
    seat_connection_fatal
              (pscp_seat,"unable to understand SFTP response packet from server: %s",pcVar2);
  }
  return pktin_00;
}

Assistant:

struct sftp_packet *sftp_wait_for_reply(struct sftp_request *req)
{
    struct sftp_packet *pktin;
    struct sftp_request *rreq;

    sftp_register(req);
    pktin = sftp_recv();
    if (pktin == NULL) {
        seat_connection_fatal(
            pscp_seat, "did not receive SFTP response packet from server");
    }
    rreq = sftp_find_request(pktin);
    if (rreq != req) {
        seat_connection_fatal(
            pscp_seat,
            "unable to understand SFTP response packet from server: %s",
            fxp_error());
    }
    return pktin;
}